

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O3

OrphanBuilder *
capnp::_::OrphanBuilder::initStructList
          (OrphanBuilder *__return_storage_ptr__,BuilderArena *arena,CapTableBuilder *capTable,
          ElementCount elementCount,StructSize elementSize)

{
  int iVar1;
  undefined1 auVar2 [16];
  StructSize SVar3;
  int iVar4;
  word *pwVar5;
  uint amount;
  ulong uVar6;
  AllocateResult AVar7;
  anon_class_1_0_00000001 local_3e;
  anon_class_1_0_00000001 local_3d;
  StructSize local_3c;
  CapTableBuilder *local_38;
  
  __return_storage_ptr__->capTable = (CapTableBuilder *)0x0;
  __return_storage_ptr__->location = (word *)0x0;
  (__return_storage_ptr__->tag).content = 0;
  __return_storage_ptr__->segment = (SegmentBuilder *)0x0;
  local_3c = elementSize;
  local_38 = capTable;
  if (0x1fffffff < elementCount) {
    ::anon_func::anon_class_1_0_00000001::operator()(&local_3d);
  }
  SVar3 = local_3c;
  uVar6 = (ulong)(((uint)local_3c & 0xffff) + ((uint)local_3c >> 0x10)) * (ulong)elementCount;
  if (0x1ffffffe < uVar6) {
    WireHelpers::initStructListPointer::anon_class_1_0_00000001::operator()(&local_3e);
  }
  iVar1 = (int)uVar6;
  amount = iVar1 + 1;
  if (arena == (BuilderArena *)0x0) {
    if (*(int *)((long)&(__return_storage_ptr__->tag).content + 4) != 0 ||
        (int)(__return_storage_ptr__->tag).content != 0) {
      WireHelpers::zeroObject((SegmentBuilder *)0x0,local_38,(WirePointer *)__return_storage_ptr__);
    }
    iVar4 = ((uint)(_DAT_00000028 - (long)__return_storage_ptr__ >> 1) & 0xfffffffc) - 3;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = _DAT_00000028;
    AVar7 = (AllocateResult)(auVar2 << 0x40);
    _DAT_00000028 = _DAT_00000028 + (ulong)amount * 8;
  }
  else {
    AVar7 = BuilderArena::allocate(arena,amount);
    iVar4 = -3;
  }
  pwVar5 = AVar7.words;
  *(int *)&(__return_storage_ptr__->tag).content = iVar4;
  *(int *)((long)&(__return_storage_ptr__->tag).content + 4) = iVar1 * 8 + 7;
  *(ElementCount *)&pwVar5->content = elementCount << 2;
  *(StructDataWordCount *)((long)&pwVar5->content + 4) = local_3c.data;
  *(StructPointerCount *)((long)&pwVar5->content + 6) = SVar3.pointers;
  __return_storage_ptr__->segment = AVar7.segment;
  __return_storage_ptr__->capTable = local_38;
  __return_storage_ptr__->location = pwVar5;
  return __return_storage_ptr__;
}

Assistant:

OrphanBuilder OrphanBuilder::initStructList(
    BuilderArena* arena, CapTableBuilder* capTable,
    ElementCount elementCount, StructSize elementSize) {
  OrphanBuilder result;
  ListBuilder builder = WireHelpers::initStructListPointer(
      result.tagAsPtr(), nullptr, capTable, elementCount, elementSize, arena);
  result.segment = builder.segment;
  result.capTable = capTable;
  result.location = builder.getLocation();
  return result;
}